

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall
iu_AssertionTest_x_iutest_x_STRNOTIN_Test::Body(iu_AssertionTest_x_iutest_x_STRNOTIN_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  char test [5];
  char *null;
  string str;
  AssertionResult local_220;
  char local_1f8 [4];
  undefined1 local_1f4;
  iuCodeMessage local_1f0;
  char local_1c0 [8];
  string local_1b8 [32];
  Fixed local_198;
  
  local_1f4 = 0;
  builtin_strncpy(local_1f8,"test",4);
  local_1c0[0] = '\0';
  local_1c0[1] = '\0';
  local_1c0[2] = '\0';
  local_1c0[3] = '\0';
  local_1c0[4] = '\0';
  local_1c0[5] = '\0';
  local_1c0[6] = '\0';
  local_1c0[7] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,local_1f8,(allocator<char> *)&local_198);
  iuutil::StrNotInHelper::Assertion<char[4],char[5]>
            (&local_220,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_1f8,(char (*) [5])in_R9);
  if (local_220.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
               ,0x14f,local_220.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&local_220);
    iuutil::StrNotInHelper::Assertion<char[4],char[5]>
              (&local_220,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_1f8,(char (*) [5])in_R9);
    if (local_220.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x150,local_220.m_message._M_dataplus._M_p);
      local_1f0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
      std::__cxx11::string::~string((string *)&local_1f0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_220);
    iuutil::StrNotInHelper::Assertion<char[4],char[5]>
              (&local_220,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_1f8,(char (*) [5])in_R9);
    if (local_220.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x151,local_220.m_message._M_dataplus._M_p);
      local_1f0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
      std::__cxx11::string::~string((string *)&local_1f0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_220);
    iuutil::StrNotInHelper::Assertion<char[4],char[5]>
              (&local_220,(StrNotInHelper *)"\"Tes\"","test","Tes",&local_1f8,(char (*) [5])in_R9);
    if (local_220.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x152,local_220.m_message._M_dataplus._M_p);
      local_1f0._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    }
    else {
      std::__cxx11::string::~string((string *)&local_220);
      iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                (&local_220,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1b8,in_R9);
      if (local_220.m_result == false) {
        memset(&local_198,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_198);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                   ,0x154,local_220.m_message._M_dataplus._M_p);
        local_1f0._44_4_ = 2;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
      }
      else {
        std::__cxx11::string::~string((string *)&local_220);
        iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                  (&local_220,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1b8,in_R9)
        ;
        if (local_220.m_result == false) {
          memset(&local_198,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x155,local_220.m_message._M_dataplus._M_p);
          local_1f0._44_4_ = 1;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
          std::__cxx11::string::~string((string *)&local_1f0);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
        }
        std::__cxx11::string::~string((string *)&local_220);
        iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                  (&local_220,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1b8,in_R9)
        ;
        if (local_220.m_result == false) {
          memset(&local_198,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x156,local_220.m_message._M_dataplus._M_p);
          local_1f0._44_4_ = 0xffffffff;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
          std::__cxx11::string::~string((string *)&local_1f0);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
        }
        std::__cxx11::string::~string((string *)&local_220);
        iuutil::StrNotInHelper::Assertion<char[4],std::__cxx11::string>
                  (&local_220,(StrNotInHelper *)"\"Tes\"","str","Tes",(char (*) [4])local_1b8,in_R9)
        ;
        if (local_220.m_result == false) {
          memset(&local_198,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_1f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x157,local_220.m_message._M_dataplus._M_p);
          local_1f0._44_4_ = 0xfffffffd;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
        }
        else {
          std::__cxx11::string::~string((string *)&local_220);
          iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                    (&local_220,(StrNotInHelper *)"null","test",local_1c0,(char **)local_1f8,
                     (char (*) [5])in_R9);
          if (local_220.m_result == false) {
            memset(&local_198,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&local_198);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                       ,0x159,local_220.m_message._M_dataplus._M_p);
            local_1f0._44_4_ = 2;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
          }
          else {
            std::__cxx11::string::~string((string *)&local_220);
            iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                      (&local_220,(StrNotInHelper *)"null","test",local_1c0,(char **)local_1f8,
                       (char (*) [5])in_R9);
            if (local_220.m_result == false) {
              memset(&local_198,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x15a,local_220.m_message._M_dataplus._M_p);
              local_1f0._44_4_ = 1;
              iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
              std::__cxx11::string::~string((string *)&local_1f0);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
            }
            std::__cxx11::string::~string((string *)&local_220);
            iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                      (&local_220,(StrNotInHelper *)"null","test",local_1c0,(char **)local_1f8,
                       (char (*) [5])in_R9);
            if (local_220.m_result == false) {
              memset(&local_198,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_1f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x15b,local_220.m_message._M_dataplus._M_p);
              local_1f0._44_4_ = 0xffffffff;
              iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
              std::__cxx11::string::~string((string *)&local_1f0);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
            }
            std::__cxx11::string::~string((string *)&local_220);
            iuutil::StrNotInHelper::Assertion<char_const*,char[5]>
                      (&local_220,(StrNotInHelper *)"null","test",local_1c0,(char **)local_1f8,
                       (char (*) [5])in_R9);
            if (local_220.m_result != false) goto LAB_00147397;
            memset(&local_198,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&local_198);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                       ,0x15c,local_220.m_message._M_dataplus._M_p);
            local_1f0._44_4_ = 0xfffffffd;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_00147397:
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string(local_1b8);
  return;
}

Assistant:

IUTEST(AssertionTest, STRNOTIN)
{
    const char test[] = "test";
    const char* null = NULL;
    ::std::string str = test;
    IUTEST_ASSERT_STRNOTIN("Tes", test);
    IUTEST_EXPECT_STRNOTIN("Tes", test);
    IUTEST_INFORM_STRNOTIN("Tes", test);
    IUTEST_ASSUME_STRNOTIN("Tes", test);

    IUTEST_ASSERT_STRNOTIN("Tes", str);
    IUTEST_EXPECT_STRNOTIN("Tes", str);
    IUTEST_INFORM_STRNOTIN("Tes", str);
    IUTEST_ASSUME_STRNOTIN("Tes", str);

    IUTEST_ASSERT_STRNOTIN(null, test);
    IUTEST_EXPECT_STRNOTIN(null, test);
    IUTEST_INFORM_STRNOTIN(null, test);
    IUTEST_ASSUME_STRNOTIN(null, test);
}